

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type * __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>
::fastAccessDx(value_type *__return_storage_ptr__,
              FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>
              *this,int i)

{
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_d8;
  value_type local_c8;
  value_type local_a8;
  value_type local_88;
  value_type local_68;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_48;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  local_38;
  
  FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>
  ::fastAccessDx(&local_68,&this->left_->fadexpr_,i);
  FadBinaryMinus<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::val(&local_88,&this->right_->fadexpr_);
  local_d8.fadexpr_.left_ = &local_68;
  local_d8.fadexpr_.right_ = &local_88;
  FadBinaryMinus<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::fastAccessDx
            (&local_a8,&this->right_->fadexpr_,i);
  FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>
  ::val(&local_c8,&this->left_->fadexpr_);
  local_38.fadexpr_.right_ = &local_48;
  local_48.fadexpr_.left_ = &local_a8;
  local_48.fadexpr_.right_ = &local_c8;
  local_38.fadexpr_.left_ = &local_d8;
  Fad<double>::
  Fad<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
            (__return_storage_ptr__,&local_38);
  Fad<double>::~Fad(&local_c8);
  Fad<double>::~Fad(&local_a8);
  Fad<double>::~Fad(&local_88);
  Fad<double>::~Fad(&local_68);
  return __return_storage_ptr__;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}